

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O3

int __thiscall capnp::TwoPartyServer::listen(TwoPartyServer *this,int __fd,int __n)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000014;
  Disposer *pDVar2;
  undefined4 in_register_00000034;
  Own<kj::_::ChainPromiseNode> OVar3;
  Own<kj::_::PromiseNode> local_58;
  Own<kj::_::PromiseNode> local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pDVar2 = (Disposer *)CONCAT44(in_register_00000014,__n);
  (**pDVar2->_vptr_Disposer)(&local_58,pDVar2);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_58,
             kj::_::
             TransformPromiseNode<kj::Promise<void>,_kj::Own<kj::AsyncIoStream>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty.c++:183:13),_kj::_::PropagateException>
             ::anon_class_16_2_8321eaef_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00623208;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)CONCAT44(in_register_00000034,__fd)
  ;
  this_00[1].dependency.disposer = pDVar2;
  local_48.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::Own<kj::AsyncIoStream>,capnp::TwoPartyServer::listen(kj::ConnectionReceiver&)::$_0,kj::_::PropagateException>>
        ::instance;
  local_48.ptr = (PromiseNode *)this_00;
  OVar3 = kj::heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_38,&local_48);
  pPVar1 = local_48.ptr;
  *(undefined4 *)&(this->super_ErrorHandler)._vptr_ErrorHandler = local_38;
  *(undefined4 *)((long)&(this->super_ErrorHandler)._vptr_ErrorHandler + 4) = uStack_34;
  *(undefined4 *)&(this->bootstrapInterface).hook.disposer = uStack_30;
  *(undefined4 *)((long)&(this->bootstrapInterface).hook.disposer + 4) = uStack_2c;
  if ((TransformPromiseNodeBase *)local_48.ptr != (TransformPromiseNodeBase *)0x0) {
    local_48.ptr = (PromiseNode *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)
              (local_48.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,OVar3.ptr);
  }
  pPVar1 = local_58.ptr;
  if (local_58.ptr != (PromiseNode *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    (**(local_58.disposer)->_vptr_Disposer)
              (local_58.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  return (int)this;
}

Assistant:

kj::Promise<void> TwoPartyServer::listen(kj::ConnectionReceiver& listener) {
  return listener.accept()
      .then([this,&listener](kj::Own<kj::AsyncIoStream>&& connection) mutable {
    accept(kj::mv(connection));
    return listen(listener);
  });
}